

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

bool __thiscall cmCacheManager::CacheEntry::GetPropertyAsBool(CacheEntry *this,string *prop)

{
  bool bVar1;
  cmValue unaff_retaddr;
  
  GetProperty(this,prop);
  bVar1 = cmIsOn(unaff_retaddr);
  return bVar1;
}

Assistant:

bool cmCacheManager::CacheEntry::GetPropertyAsBool(
  const std::string& prop) const
{
  return cmIsOn(this->GetProperty(prop));
}